

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  xmlXPathCompExprPtr pxVar4;
  xmlXPathStepOp *pxVar5;
  int iVar6;
  xmlXPathOp xVar7;
  xmlXPathOp xVar8;
  int iVar9;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar10;
  xmlXPathObjectPtr pxVar11;
  xmlNodePtr *ppxVar12;
  long lVar13;
  xmlXPathContextPtr ctxt_00;
  xmlNodePtr local_38;
  
  if (ctxt->error != 0) {
    return 0;
  }
  ctxt_00 = ctxt->context;
  if (ctxt_00->opLimit != 0) {
    iVar6 = xmlXPathCheckOpLimit(ctxt,1);
    if (iVar6 < 0) {
      return 0;
    }
    ctxt_00 = ctxt->context;
  }
  if (4999 < ctxt_00->depth) {
    iVar6 = 0x1a;
LAB_001d9212:
    xmlXPathErr(ctxt,iVar6);
    return 0;
  }
  ctxt_00->depth = ctxt_00->depth + 1;
  xVar7 = op->op;
  if (XPATH_OP_SORT < xVar7) {
switchD_001d9244_caseD_1:
    xVar7 = xmlXPathCompOpEval(ctxt,op);
    goto switchD_001d9244_caseD_0;
  }
  pxVar4 = ctxt->comp;
  switch(xVar7) {
  case XPATH_OP_END:
    goto switchD_001d9244_caseD_0;
  default:
    goto switchD_001d9244_caseD_1;
  case XPATH_OP_UNION:
    xVar7 = xmlXPathCompOpEvalFirst(ctxt,pxVar4->steps + op->ch1,first);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar11 = ctxt->value;
    if (((pxVar11 != (xmlXPathObjectPtr)0x0) && (pxVar11->type == XPATH_NODESET)) &&
       ((pxVar10 = pxVar11->nodesetval, pxVar10 != (xmlNodeSetPtr)0x0 && (0 < pxVar10->nodeNr)))) {
      if (pxVar10->nodeNr != 1) {
        xmlXPathNodeSetSort(pxVar10);
        pxVar10 = ctxt->value->nodesetval;
      }
      *first = *pxVar10->nodeTab;
    }
    iVar6 = xmlXPathCompOpEvalFirst(ctxt,pxVar4->steps + op->ch2,first);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar11 = valuePop(ctxt);
    obj = valuePop(ctxt);
    if (((obj == (xmlXPathObjectPtr)0x0) ||
        (pxVar11 == (xmlXPathObjectPtr)0x0 || obj->type != XPATH_NODESET)) ||
       (pxVar11->type != XPATH_NODESET)) {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar11);
      iVar6 = 0xb;
      goto LAB_001d9212;
    }
    if ((ctxt->context->opLimit == 0) ||
       (((obj->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar9 = xmlXPathCheckOpLimit(ctxt,(long)obj->nodesetval->nodeNr), -1 < iVar9)) &&
        ((pxVar11->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar9 = xmlXPathCheckOpLimit(ctxt,(long)pxVar11->nodesetval->nodeNr), -1 < iVar9)))))) {
      pxVar10 = xmlXPathNodeSetMerge(obj->nodesetval,pxVar11->nodesetval);
      obj->nodesetval = pxVar10;
      valuePush(ctxt,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar11);
      if (iVar6 < (int)xVar7) {
        uVar2 = op->ch1;
        uVar3 = op->ch2;
        op->ch1 = uVar3;
        op->ch2 = uVar2;
      }
      xVar7 = xVar7 + iVar6;
    }
    else {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar11);
    }
    goto switchD_001d9244_caseD_0;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    break;
  case XPATH_OP_NODE:
    xVar7 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar7 = xmlXPathCompOpEval(ctxt,pxVar4->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar6 = xmlXPathCompOpEval(ctxt,pxVar4->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar7 = iVar6 + xVar7;
    }
    pxVar11 = xmlXPathCacheNewNodeSet(ctxt->context,ctxt->context->node);
    valuePush(ctxt,pxVar11);
    goto switchD_001d9244_caseD_0;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar6 = xmlXPathCompOpEval(ctxt,pxVar4->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar9 = xmlXPathNodeCollectAndTest(ctxt,op,first,(xmlNodePtr *)0x0,0);
      xVar7 = iVar9 + iVar6;
      goto switchD_001d9244_caseD_0;
    }
    break;
  case XPATH_OP_VALUE:
    pxVar11 = xmlXPathCacheObjectCopy(ctxt_00,(xmlXPathObjectPtr)op->value4);
    valuePush(ctxt,pxVar11);
    break;
  case XPATH_OP_FILTER:
    if (ctxt->error == 0) {
      iVar6 = op->ch1;
      xVar8 = XPATH_OP_END;
      if ((long)iVar6 == -1) {
LAB_001d9445:
        xVar7 = XPATH_OP_END;
        if (((ctxt->error != 0) || (xVar7 = xVar8, op->ch2 == -1)) ||
           (pxVar11 = ctxt->value, pxVar11 == (xmlXPathObjectPtr)0x0))
        goto switchD_001d9244_caseD_0;
        if (pxVar11->type != XPATH_NODESET) {
          xmlXPathErr(ctxt,0xb);
          xVar7 = XPATH_OP_END;
          goto switchD_001d9244_caseD_0;
        }
        pxVar10 = pxVar11->nodesetval;
        if ((pxVar10 == (xmlNodeSetPtr)0x0) ||
           (xmlXPathNodeSetFilter(ctxt,pxVar10,op->ch2,1,1,1), pxVar10->nodeNr < 1))
        goto switchD_001d9244_caseD_0;
        ppxVar12 = pxVar10->nodeTab;
      }
      else {
        lVar13 = (long)op->ch2;
        if (((((lVar13 == -1) || (pxVar5 = pxVar4->steps, pxVar5[iVar6].op != XPATH_OP_SORT)) ||
             ((pxVar5[lVar13].op != XPATH_OP_SORT ||
              ((lVar13 = (long)pxVar5[lVar13].ch1, lVar13 == -1 ||
               (pxVar5[lVar13].op != XPATH_OP_FUNCTION)))))) ||
            (pxVar5[lVar13].value5 != (void *)0x0)) ||
           ((pxVar5[lVar13].value != 0 || ((xmlChar *)pxVar5[lVar13].value4 == (xmlChar *)0x0)))) {
LAB_001d9430:
          xVar8 = xmlXPathCompOpEval(ctxt,pxVar4->steps + iVar6);
          goto LAB_001d9445;
        }
        iVar9 = xmlStrEqual((xmlChar *)pxVar5[lVar13].value4,(xmlChar *)"last");
        iVar6 = op->ch1;
        if (iVar9 == 0) {
          xVar8 = XPATH_OP_END;
          if (iVar6 == -1) goto LAB_001d9445;
          goto LAB_001d9430;
        }
        local_38 = (xmlNodePtr)0x0;
        xVar8 = xmlXPathCompOpEvalLast(ctxt,pxVar4->steps + iVar6,&local_38);
        xVar7 = XPATH_OP_END;
        if (((ctxt->error != 0) ||
            (pxVar11 = ctxt->value, xVar7 = xVar8, pxVar11 == (xmlXPathObjectPtr)0x0)) ||
           ((pxVar11->type != XPATH_NODESET ||
            (((pxVar10 = pxVar11->nodesetval, pxVar10 == (xmlNodeSetPtr)0x0 ||
              (pxVar10->nodeTab == (xmlNodePtr *)0x0)) || (pxVar10->nodeNr < 2))))))
        goto switchD_001d9244_caseD_0;
        xmlXPathNodeSetKeepLast(pxVar10);
        ppxVar12 = ctxt->value->nodesetval->nodeTab;
      }
      *first = *ppxVar12;
      xVar7 = xVar8;
      goto switchD_001d9244_caseD_0;
    }
    break;
  case XPATH_OP_SORT:
    xVar7 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar7 = xmlXPathCompOpEvalFirst(ctxt,pxVar4->steps + op->ch1,first);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar11 = ctxt->value;
    if ((((pxVar11 != (xmlXPathObjectPtr)0x0) && (pxVar11->type == XPATH_NODESET)) &&
        (pxVar10 = pxVar11->nodesetval, pxVar10 != (xmlNodeSetPtr)0x0)) && (1 < pxVar10->nodeNr)) {
      xmlXPathNodeSetSort(pxVar10);
    }
    goto switchD_001d9244_caseD_0;
  }
  xVar7 = XPATH_OP_END;
switchD_001d9244_caseD_0:
  piVar1 = &ctxt->context->depth;
  *piVar1 = *piVar1 + -1;
  return xVar7;
}

Assistant:

static int
xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,
                        xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0, cur;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_UNION:
            total =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                        first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
                && (ctxt->value->nodesetval->nodeNr >= 1)) {
                /*
                 * limit tree traversing to first node in the result
                 */
		/*
		* OPTIMIZE TODO: This implicitly sorts
		*  the result, even if not needed. E.g. if the argument
		*  of the count() function, no sorting is needed.
		* OPTIMIZE TODO: How do we know if the node-list wasn't
		*  already sorted?
		*/
		if (ctxt->value->nodesetval->nodeNr > 1)
		    xmlXPathNodeSetSort(ctxt->value->nodesetval);
                *first = ctxt->value->nodesetval->nodeTab[0];
            }
            cur =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch2],
                                        first);
	    CHECK_ERROR0;

            arg2 = valuePop(ctxt);
            arg1 = valuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

            /* TODO: Check memory error. */
            arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
                                                    arg2->nodesetval);
            valuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            /* optimizer */
	    if (total > cur)
		xmlXPathCompSwap(op);
            total += cur;
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
		ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total = xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, first, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            valuePush(ctxt,
                      xmlXPathCacheObjectCopy(ctxt->context,
			(xmlXPathObjectPtr) op->value4));
            break;
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total +=
                    xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                            first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
		&& (ctxt->value->nodesetval->nodeNr > 1))
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
            break;
#ifdef XP_OPTIMIZED_FILTER_FIRST
	case XPATH_OP_FILTER:
                total += xmlXPathCompOpEvalFilterFirst(ctxt, op, first);
            break;
#endif
        default:
            total += xmlXPathCompOpEval(ctxt, op);
            break;
    }

    ctxt->context->depth -= 1;
    return(total);
}